

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000018b610 = 0x2d2d2d2d2d2d2d;
    uRam000000000018b617._0_1_ = '-';
    uRam000000000018b617._1_1_ = '-';
    uRam000000000018b617._2_1_ = '-';
    uRam000000000018b617._3_1_ = '-';
    uRam000000000018b617._4_1_ = '-';
    uRam000000000018b617._5_1_ = '-';
    uRam000000000018b617._6_1_ = '-';
    uRam000000000018b617._7_1_ = '-';
    DAT_0018b600 = '-';
    DAT_0018b600_1._0_1_ = '-';
    DAT_0018b600_1._1_1_ = '-';
    DAT_0018b600_1._2_1_ = '-';
    DAT_0018b600_1._3_1_ = '-';
    DAT_0018b600_1._4_1_ = '-';
    DAT_0018b600_1._5_1_ = '-';
    DAT_0018b600_1._6_1_ = '-';
    uRam000000000018b608 = 0x2d2d2d2d2d2d2d;
    DAT_0018b60f = 0x2d;
    DAT_0018b5f0 = '-';
    DAT_0018b5f0_1._0_1_ = '-';
    DAT_0018b5f0_1._1_1_ = '-';
    DAT_0018b5f0_1._2_1_ = '-';
    DAT_0018b5f0_1._3_1_ = '-';
    DAT_0018b5f0_1._4_1_ = '-';
    DAT_0018b5f0_1._5_1_ = '-';
    DAT_0018b5f0_1._6_1_ = '-';
    uRam000000000018b5f8._0_1_ = '-';
    uRam000000000018b5f8._1_1_ = '-';
    uRam000000000018b5f8._2_1_ = '-';
    uRam000000000018b5f8._3_1_ = '-';
    uRam000000000018b5f8._4_1_ = '-';
    uRam000000000018b5f8._5_1_ = '-';
    uRam000000000018b5f8._6_1_ = '-';
    uRam000000000018b5f8._7_1_ = '-';
    DAT_0018b5e0 = '-';
    DAT_0018b5e0_1._0_1_ = '-';
    DAT_0018b5e0_1._1_1_ = '-';
    DAT_0018b5e0_1._2_1_ = '-';
    DAT_0018b5e0_1._3_1_ = '-';
    DAT_0018b5e0_1._4_1_ = '-';
    DAT_0018b5e0_1._5_1_ = '-';
    DAT_0018b5e0_1._6_1_ = '-';
    uRam000000000018b5e8._0_1_ = '-';
    uRam000000000018b5e8._1_1_ = '-';
    uRam000000000018b5e8._2_1_ = '-';
    uRam000000000018b5e8._3_1_ = '-';
    uRam000000000018b5e8._4_1_ = '-';
    uRam000000000018b5e8._5_1_ = '-';
    uRam000000000018b5e8._6_1_ = '-';
    uRam000000000018b5e8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000018b5d8._0_1_ = '-';
    uRam000000000018b5d8._1_1_ = '-';
    uRam000000000018b5d8._2_1_ = '-';
    uRam000000000018b5d8._3_1_ = '-';
    uRam000000000018b5d8._4_1_ = '-';
    uRam000000000018b5d8._5_1_ = '-';
    uRam000000000018b5d8._6_1_ = '-';
    uRam000000000018b5d8._7_1_ = '-';
    DAT_0018b61f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }